

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

string * __thiscall
ASTree::dotName_abi_cxx11_(string *__return_storage_ptr__,ASTree *this,ASTree *ast)

{
  ASTree *pAVar1;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *__x;
  ulong uVar2;
  size_type sVar3;
  reference ppAVar4;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  undefined1 local_50 [4];
  int j;
  vector<ASTree_*,_std::allocator<ASTree_*>_> subtreesParent;
  allocator<char> local_21;
  ASTree *local_20;
  ASTree *ast_local;
  ASTree *this_local;
  
  local_20 = ast;
  ast_local = this;
  this_local = (ASTree *)__return_storage_ptr__;
  pAVar1 = getParent(ast);
  if (pAVar1 == (ASTree *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"T",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    pAVar1 = getParent(local_20);
    __x = getSubtrees(pAVar1);
    std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector
              ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_50,__x);
    local_54 = 0;
    while ((uVar2 = (ulong)local_54,
           sVar3 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::size
                             ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_50),
           uVar2 < sVar3 &&
           (ppAVar4 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::operator[]
                                ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_50,
                                 (long)local_54), *ppAVar4 != local_20))) {
      local_54 = local_54 + 1;
    }
    dotName_abi_cxx11_(&local_98,this,local_20->parent);
    std::__cxx11::to_string(&local_b8,local_54);
    std::operator+(&local_78,&local_98,&local_b8);
    std::operator+(__return_storage_ptr__,&local_78,"N");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::vector<ASTree_*,_std::allocator<ASTree_*>_>::~vector
              ((vector<ASTree_*,_std::allocator<ASTree_*>_> *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ASTree::dotName(ASTree *ast) {
    // This generates an unique identifier
    if (!ast->getParent()) {
        return "T";
    } else {
        auto subtreesParent = ast->getParent()->getSubtrees();
        int j;
        for (j = 0; j < subtreesParent.size(); ++j) {
            if (subtreesParent[j] == ast) {
                break;
            }
        }
        return dotName(ast->parent) + std::to_string(j) + "N";
    }
}